

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

optional<std::array<tinyusdz::value::half,_3UL>_> * __thiscall
tinyusdz::XformOp::get_value<std::array<tinyusdz::value::half,3ul>>
          (optional<std::array<tinyusdz::value::half,_3UL>_> *__return_storage_ptr__,XformOp *this,
          double t,TimeSampleInterpolationType interp)

{
  bool bVar1;
  PrimVar *this_00;
  array<tinyusdz::value::half,_3UL> value;
  array<tinyusdz::value::half,_3UL> local_36;
  optional<std::array<tinyusdz::value::half,_3UL>_> local_30;
  double local_28;
  
  this_00 = &this->_var;
  local_28 = t;
  bVar1 = primvar::PrimVar::is_timesamples(this_00);
  if (bVar1) {
    bVar1 = primvar::PrimVar::get_interpolated_value<std::array<tinyusdz::value::half,3ul>>
                      (this_00,local_28,interp,&local_36);
    if (!bVar1) {
      *(undefined2 *)((long)&__return_storage_ptr__->contained + 4) = 0;
      *(undefined4 *)&__return_storage_ptr__->contained = 0;
    }
    else {
      *(uint16_t *)((long)&__return_storage_ptr__->contained + 4) = local_36._M_elems[2].value;
      *(undefined4 *)&__return_storage_ptr__->contained = local_36._M_elems._0_4_;
    }
    __return_storage_ptr__->has_value_ = bVar1;
  }
  else {
    primvar::PrimVar::get_value<std::array<tinyusdz::value::half,3ul>>(&local_30,this_00);
    __return_storage_ptr__->has_value_ = local_30.has_value_;
    if (local_30.has_value_ == true) {
      *(undefined2 *)((long)&__return_storage_ptr__->contained + 4) = local_30.contained._4_2_;
      *(undefined4 *)&__return_storage_ptr__->contained = local_30.contained._0_4_;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value(double t = value::TimeCode::Default(), 
          value::TimeSampleInterpolationType interp =
               value::TimeSampleInterpolationType::Linear) const {
    if (is_timesamples()) {
      T value;
      if (get_interpolated_value(&value, t, interp)) {
        return value;
      }
      return nonstd::nullopt;
    }

    return _var.get_value<T>();
  }